

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::pattern_formatter::handle_flag_(pattern_formatter *this,char flag,padding_info padding)

{
  value_type *__x;
  undefined1 in_SIL;
  long in_RDI;
  __single_object unknown_flag;
  value_type *in_stack_fffffffffffff9c8;
  char ch;
  aggregate_formatter *in_stack_fffffffffffff9d0;
  vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  *this_00;
  unique_ptr<spdlog::details::A_formatter,_std::default_delete<spdlog::details::A_formatter>_>
  *in_stack_fffffffffffff9d8;
  pointer *__u;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  *in_stack_fffffffffffff9e0;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  *this_01;
  padding_info *in_stack_fffffffffffffa08;
  vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  local_298;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_280 [80];
  
  switch(in_SIL) {
  case 0x21:
    std::make_unique<spdlog::details::source_funcname_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::source_funcname_formatter,std::default_delete<spdlog::details::source_funcname_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::source_funcname_formatter,_std::default_delete<spdlog::details::source_funcname_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::source_funcname_formatter,_std::default_delete<spdlog::details::source_funcname_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::source_funcname_formatter,_std::default_delete<spdlog::details::source_funcname_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    break;
  default:
    __u = &local_298.
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    std::make_unique<spdlog::details::aggregate_formatter>();
    ch = (char)((ulong)in_stack_fffffffffffff9c8 >> 0x38);
    std::
    unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ::operator->((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                  *)0x126b61);
    details::aggregate_formatter::add_ch(in_stack_fffffffffffff9d0,ch);
    std::
    unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ::operator->((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                  *)0x126b7d);
    details::aggregate_formatter::add_ch(in_stack_fffffffffffff9d0,ch);
    __x = (value_type *)(in_RDI + 0x90);
    this_00 = &local_298;
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::aggregate_formatter,std::default_delete<spdlog::details::aggregate_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                *)__u);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(this_00,__x);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)this_00);
    std::
    unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                   *)this_00);
    break;
  case 0x23:
    std::make_unique<spdlog::details::source_linenum_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::source_linenum_formatter,std::default_delete<spdlog::details::source_linenum_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::source_linenum_formatter,_std::default_delete<spdlog::details::source_linenum_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::source_linenum_formatter,_std::default_delete<spdlog::details::source_linenum_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::source_linenum_formatter,_std::default_delete<spdlog::details::source_linenum_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    break;
  case 0x24:
    std::make_unique<spdlog::details::color_stop_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::color_stop_formatter,std::default_delete<spdlog::details::color_stop_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::color_stop_formatter,_std::default_delete<spdlog::details::color_stop_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::color_stop_formatter,_std::default_delete<spdlog::details::color_stop_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::color_stop_formatter,_std::default_delete<spdlog::details::color_stop_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    break;
  case 0x25:
    local_298.
    super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x25;
    this_01 = local_280;
    std::make_unique<spdlog::details::ch_formatter,char>((char *)(in_RDI + 0x90));
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::ch_formatter,std::default_delete<spdlog::details::ch_formatter>,void>
              (this_01,(unique_ptr<spdlog::details::ch_formatter,_std::default_delete<spdlog::details::ch_formatter>_>
                        *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::ch_formatter,_std::default_delete<spdlog::details::ch_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::ch_formatter,_std::default_delete<spdlog::details::ch_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x2b:
    std::make_unique<spdlog::details::full_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::full_formatter,std::default_delete<spdlog::details::full_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::full_formatter,_std::default_delete<spdlog::details::full_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::full_formatter,_std::default_delete<spdlog::details::full_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::full_formatter,_std::default_delete<spdlog::details::full_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    break;
  case 0x40:
    std::make_unique<spdlog::details::source_location_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::source_location_formatter,std::default_delete<spdlog::details::source_location_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::source_location_formatter,_std::default_delete<spdlog::details::source_location_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::source_location_formatter,_std::default_delete<spdlog::details::source_location_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::source_location_formatter,_std::default_delete<spdlog::details::source_location_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    break;
  case 0x41:
    std::make_unique<spdlog::details::A_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::A_formatter,std::default_delete<spdlog::details::A_formatter>,void>
              (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::A_formatter,_std::default_delete<spdlog::details::A_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::A_formatter,_std::default_delete<spdlog::details::A_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x42:
    std::make_unique<spdlog::details::B_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::B_formatter,std::default_delete<spdlog::details::B_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::B_formatter,_std::default_delete<spdlog::details::B_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::B_formatter,_std::default_delete<spdlog::details::B_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::B_formatter,_std::default_delete<spdlog::details::B_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x43:
    std::make_unique<spdlog::details::C_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::C_formatter,std::default_delete<spdlog::details::C_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::C_formatter,_std::default_delete<spdlog::details::C_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::C_formatter,_std::default_delete<spdlog::details::C_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::C_formatter,_std::default_delete<spdlog::details::C_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x44:
  case 0x78:
    std::make_unique<spdlog::details::D_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::D_formatter,std::default_delete<spdlog::details::D_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::D_formatter,_std::default_delete<spdlog::details::D_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::D_formatter,_std::default_delete<spdlog::details::D_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::D_formatter,_std::default_delete<spdlog::details::D_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x45:
    std::make_unique<spdlog::details::E_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::E_formatter,std::default_delete<spdlog::details::E_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::E_formatter,_std::default_delete<spdlog::details::E_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::E_formatter,_std::default_delete<spdlog::details::E_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::E_formatter,_std::default_delete<spdlog::details::E_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x46:
    std::make_unique<spdlog::details::F_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::F_formatter,std::default_delete<spdlog::details::F_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::F_formatter,_std::default_delete<spdlog::details::F_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::F_formatter,_std::default_delete<spdlog::details::F_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::F_formatter,_std::default_delete<spdlog::details::F_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x48:
    std::make_unique<spdlog::details::H_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::H_formatter,std::default_delete<spdlog::details::H_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::H_formatter,_std::default_delete<spdlog::details::H_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::H_formatter,_std::default_delete<spdlog::details::H_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::H_formatter,_std::default_delete<spdlog::details::H_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x49:
    std::make_unique<spdlog::details::I_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::I_formatter,std::default_delete<spdlog::details::I_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::I_formatter,_std::default_delete<spdlog::details::I_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::I_formatter,_std::default_delete<spdlog::details::I_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::I_formatter,_std::default_delete<spdlog::details::I_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x4c:
    std::make_unique<spdlog::details::short_level_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::short_level_formatter,std::default_delete<spdlog::details::short_level_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::short_level_formatter,_std::default_delete<spdlog::details::short_level_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::short_level_formatter,_std::default_delete<spdlog::details::short_level_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::short_level_formatter,_std::default_delete<spdlog::details::short_level_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    break;
  case 0x4d:
    std::make_unique<spdlog::details::M_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::M_formatter,std::default_delete<spdlog::details::M_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::M_formatter,_std::default_delete<spdlog::details::M_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::M_formatter,_std::default_delete<spdlog::details::M_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::M_formatter,_std::default_delete<spdlog::details::M_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x50:
    std::make_unique<spdlog::details::pid_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::pid_formatter,std::default_delete<spdlog::details::pid_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::pid_formatter,_std::default_delete<spdlog::details::pid_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::pid_formatter,_std::default_delete<spdlog::details::pid_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::pid_formatter,_std::default_delete<spdlog::details::pid_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    break;
  case 0x52:
    std::make_unique<spdlog::details::R_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::R_formatter,std::default_delete<spdlog::details::R_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::R_formatter,_std::default_delete<spdlog::details::R_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::R_formatter,_std::default_delete<spdlog::details::R_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::R_formatter,_std::default_delete<spdlog::details::R_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x53:
    std::make_unique<spdlog::details::S_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::S_formatter,std::default_delete<spdlog::details::S_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::S_formatter,_std::default_delete<spdlog::details::S_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::S_formatter,_std::default_delete<spdlog::details::S_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::S_formatter,_std::default_delete<spdlog::details::S_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x54:
  case 0x58:
    std::make_unique<spdlog::details::T_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::T_formatter,std::default_delete<spdlog::details::T_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::T_formatter,_std::default_delete<spdlog::details::T_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::T_formatter,_std::default_delete<spdlog::details::T_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::T_formatter,_std::default_delete<spdlog::details::T_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x59:
    std::make_unique<spdlog::details::Y_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::Y_formatter,std::default_delete<spdlog::details::Y_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::Y_formatter,_std::default_delete<spdlog::details::Y_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::Y_formatter,_std::default_delete<spdlog::details::Y_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::Y_formatter,_std::default_delete<spdlog::details::Y_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x5e:
    std::make_unique<spdlog::details::color_start_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::color_start_formatter,std::default_delete<spdlog::details::color_start_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::color_start_formatter,_std::default_delete<spdlog::details::color_start_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::color_start_formatter,_std::default_delete<spdlog::details::color_start_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::color_start_formatter,_std::default_delete<spdlog::details::color_start_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    break;
  case 0x61:
    std::make_unique<spdlog::details::a_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::a_formatter,std::default_delete<spdlog::details::a_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::a_formatter,_std::default_delete<spdlog::details::a_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::a_formatter,_std::default_delete<spdlog::details::a_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::a_formatter,_std::default_delete<spdlog::details::a_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x62:
  case 0x68:
    std::make_unique<spdlog::details::b_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::b_formatter,std::default_delete<spdlog::details::b_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::b_formatter,_std::default_delete<spdlog::details::b_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::b_formatter,_std::default_delete<spdlog::details::b_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::b_formatter,_std::default_delete<spdlog::details::b_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 99:
    std::make_unique<spdlog::details::c_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::c_formatter,std::default_delete<spdlog::details::c_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::c_formatter,_std::default_delete<spdlog::details::c_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::c_formatter,_std::default_delete<spdlog::details::c_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::c_formatter,_std::default_delete<spdlog::details::c_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 100:
    std::make_unique<spdlog::details::d_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::d_formatter,std::default_delete<spdlog::details::d_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::d_formatter,_std::default_delete<spdlog::details::d_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::d_formatter,_std::default_delete<spdlog::details::d_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::d_formatter,_std::default_delete<spdlog::details::d_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x65:
    std::make_unique<spdlog::details::e_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::e_formatter,std::default_delete<spdlog::details::e_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::e_formatter,_std::default_delete<spdlog::details::e_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::e_formatter,_std::default_delete<spdlog::details::e_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::e_formatter,_std::default_delete<spdlog::details::e_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x66:
    std::make_unique<spdlog::details::f_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::f_formatter,std::default_delete<spdlog::details::f_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::f_formatter,_std::default_delete<spdlog::details::f_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::f_formatter,_std::default_delete<spdlog::details::f_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::f_formatter,_std::default_delete<spdlog::details::f_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x6c:
    std::make_unique<spdlog::details::level_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::level_formatter,std::default_delete<spdlog::details::level_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::level_formatter,_std::default_delete<spdlog::details::level_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::level_formatter,_std::default_delete<spdlog::details::level_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::level_formatter,_std::default_delete<spdlog::details::level_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    break;
  case 0x6d:
    std::make_unique<spdlog::details::m_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::m_formatter,std::default_delete<spdlog::details::m_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::m_formatter,_std::default_delete<spdlog::details::m_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::m_formatter,_std::default_delete<spdlog::details::m_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::m_formatter,_std::default_delete<spdlog::details::m_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x6e:
    std::make_unique<spdlog::details::name_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::name_formatter,std::default_delete<spdlog::details::name_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::name_formatter,_std::default_delete<spdlog::details::name_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::name_formatter,_std::default_delete<spdlog::details::name_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::name_formatter,_std::default_delete<spdlog::details::name_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    break;
  case 0x70:
    std::make_unique<spdlog::details::p_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::p_formatter,std::default_delete<spdlog::details::p_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::p_formatter,_std::default_delete<spdlog::details::p_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::p_formatter,_std::default_delete<spdlog::details::p_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::p_formatter,_std::default_delete<spdlog::details::p_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x72:
    std::make_unique<spdlog::details::r_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::r_formatter,std::default_delete<spdlog::details::r_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::r_formatter,_std::default_delete<spdlog::details::r_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::r_formatter,_std::default_delete<spdlog::details::r_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::r_formatter,_std::default_delete<spdlog::details::r_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x73:
    std::make_unique<spdlog::details::source_filename_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::source_filename_formatter,std::default_delete<spdlog::details::source_filename_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::source_filename_formatter,_std::default_delete<spdlog::details::source_filename_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::source_filename_formatter,_std::default_delete<spdlog::details::source_filename_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::source_filename_formatter,_std::default_delete<spdlog::details::source_filename_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    break;
  case 0x74:
    std::make_unique<spdlog::details::t_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::t_formatter,std::default_delete<spdlog::details::t_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::t_formatter,_std::default_delete<spdlog::details::t_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::t_formatter,_std::default_delete<spdlog::details::t_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::t_formatter,_std::default_delete<spdlog::details::t_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x76:
    std::make_unique<spdlog::details::v_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::v_formatter,std::default_delete<spdlog::details::v_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::v_formatter,_std::default_delete<spdlog::details::v_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::v_formatter,_std::default_delete<spdlog::details::v_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::v_formatter,_std::default_delete<spdlog::details::v_formatter>_>
                 *)in_stack_fffffffffffff9d0);
    break;
  case 0x7a:
    std::make_unique<spdlog::details::z_formatter,spdlog::details::padding_info&>
              (in_stack_fffffffffffffa08);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::z_formatter,std::default_delete<spdlog::details::z_formatter>,void>
              (in_stack_fffffffffffff9e0,
               (unique_ptr<spdlog::details::z_formatter,_std::default_delete<spdlog::details::z_formatter>_>
                *)in_stack_fffffffffffff9d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_fffffffffffff9d0);
    std::
    unique_ptr<spdlog::details::z_formatter,_std::default_delete<spdlog::details::z_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::z_formatter,_std::default_delete<spdlog::details::z_formatter>_>
                 *)in_stack_fffffffffffff9d0);
  }
  return;
}

Assistant:

void handle_flag_(char flag, details::padding_info padding)
    {
        switch (flag)
        {

        case ('+'): // default formatter
            formatters_.push_back(details::make_unique<details::full_formatter>(padding));
            break;

        case 'n': // logger name
            formatters_.push_back(details::make_unique<details::name_formatter>(padding));
            break;

        case 'l': // level
            formatters_.push_back(details::make_unique<details::level_formatter>(padding));
            break;

        case 'L': // short level
            formatters_.push_back(details::make_unique<details::short_level_formatter>(padding));
            break;

        case ('t'): // thread id
            formatters_.push_back(details::make_unique<details::t_formatter>(padding));
            break;

        case ('v'): // the message text
            formatters_.push_back(details::make_unique<details::v_formatter>(padding));
            break;

        case ('a'): // weekday
            formatters_.push_back(details::make_unique<details::a_formatter>(padding));
            break;

        case ('A'): // short weekday
            formatters_.push_back(details::make_unique<details::A_formatter>(padding));
            break;

        case ('b'):
        case ('h'): // month
            formatters_.push_back(details::make_unique<details::b_formatter>(padding));
            break;

        case ('B'): // short month
            formatters_.push_back(details::make_unique<details::B_formatter>(padding));
            break;

        case ('c'): // datetime
            formatters_.push_back(details::make_unique<details::c_formatter>(padding));
            break;

        case ('C'): // year 2 digits
            formatters_.push_back(details::make_unique<details::C_formatter>(padding));
            break;

        case ('Y'): // year 4 digits
            formatters_.push_back(details::make_unique<details::Y_formatter>(padding));
            break;

        case ('D'):
        case ('x'): // datetime MM/DD/YY
            formatters_.push_back(details::make_unique<details::D_formatter>(padding));
            break;

        case ('m'): // month 1-12
            formatters_.push_back(details::make_unique<details::m_formatter>(padding));
            break;

        case ('d'): // day of month 1-31
            formatters_.push_back(details::make_unique<details::d_formatter>(padding));
            break;

        case ('H'): // hours 24
            formatters_.push_back(details::make_unique<details::H_formatter>(padding));
            break;

        case ('I'): // hours 12
            formatters_.push_back(details::make_unique<details::I_formatter>(padding));
            break;

        case ('M'): // minutes
            formatters_.push_back(details::make_unique<details::M_formatter>(padding));
            break;

        case ('S'): // seconds
            formatters_.push_back(details::make_unique<details::S_formatter>(padding));
            break;

        case ('e'): // milliseconds
            formatters_.push_back(details::make_unique<details::e_formatter>(padding));
            break;

        case ('f'): // microseconds
            formatters_.push_back(details::make_unique<details::f_formatter>(padding));
            break;

        case ('F'): // nanoseconds
            formatters_.push_back(details::make_unique<details::F_formatter>(padding));
            break;

        case ('E'): // seconds since epoch
            formatters_.push_back(details::make_unique<details::E_formatter>(padding));
            break;

        case ('p'): // am/pm
            formatters_.push_back(details::make_unique<details::p_formatter>(padding));
            break;

        case ('r'): // 12 hour clock 02:55:02 pm
            formatters_.push_back(details::make_unique<details::r_formatter>(padding));
            break;

        case ('R'): // 24-hour HH:MM time
            formatters_.push_back(details::make_unique<details::R_formatter>(padding));
            break;

        case ('T'):
        case ('X'): // ISO 8601 time format (HH:MM:SS)
            formatters_.push_back(details::make_unique<details::T_formatter>(padding));
            break;

        case ('z'): // timezone
            formatters_.push_back(details::make_unique<details::z_formatter>(padding));
            break;

        case ('P'): // pid
            formatters_.push_back(details::make_unique<details::pid_formatter>(padding));
            break;

#ifdef SPDLOG_ENABLE_MESSAGE_COUNTER
        case ('i'):
            formatters_.push_back(details::make_unique<details::i_formatter>(padding));
            break;
#endif
        case ('^'): // color range start
            formatters_.push_back(details::make_unique<details::color_start_formatter>(padding));
            break;

        case ('$'): // color range end
            formatters_.push_back(details::make_unique<details::color_stop_formatter>(padding));
            break;

        case ('@'): // source location (filename:filenumber)
            formatters_.push_back(details::make_unique<details::source_location_formatter>(padding));
            break;

        case ('s'): // source filename
            formatters_.push_back(details::make_unique<details::source_filename_formatter>(padding));
            break;

        case ('#'): // source line number
            formatters_.push_back(details::make_unique<details::source_linenum_formatter>(padding));
            break;

        case ('!'): // source funcname
            formatters_.push_back(details::make_unique<details::source_funcname_formatter>(padding));
            break;

        case ('%'): // % char
            formatters_.push_back(details::make_unique<details::ch_formatter>('%'));
            break;

        default: // Unknown flag appears as is
            auto unknown_flag = details::make_unique<details::aggregate_formatter>();
            unknown_flag->add_ch('%');
            unknown_flag->add_ch(flag);
            formatters_.push_back((std::move(unknown_flag)));
            break;
        }
    }